

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O2

uint64_t helper_iwmmxt_sral_arm(CPUARMState *env,uint64_t x,uint32_t n)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = (ulong)(long)(int)x >> ((byte)n & 0x3f);
  uVar4 = uVar1 & 0xffffffff;
  uVar3 = (ulong)((long)x >> 0x20) >> ((byte)n & 0x3f);
  uVar2 = (uint)uVar3;
  (env->iwmmxt).cregs[3] =
       uVar2 & 0x80000000 | (uint)(uVar4 == 0) << 0xe | (uint)uVar1 >> 0x10 & 0x8000 |
       (uint)(uVar2 == 0) << 0x1e;
  return uVar3 << 0x20 | uVar4;
}

Assistant:

uint64_t HELPER(iwmmxt_sral)(CPUARMState *env, uint64_t x, uint32_t n)
{
    x = (((EXTEND32(x >> 0) >> n) & 0xffffffff) << 0) |
        (((EXTEND32(x >> 32) >> n) & 0xffffffff) << 32);
    env->iwmmxt.cregs[ARM_IWMMXT_wCASF] =
        NZBIT32(x >> 0, 0) | NZBIT32(x >> 32, 1);
    return x;
}